

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

bool __thiscall
QPlainTextEditControl::canInsertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  undefined1 uVar1;
  bool bVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  
  auVar4 = QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject);
  plVar3 = auVar4._0_8_;
  if (plVar3 != (long *)0x0) {
    uVar1 = (**(code **)(*plVar3 + 0x1d8))(plVar3,source,auVar4._8_8_,*(code **)(*plVar3 + 0x1d8));
    return (bool)uVar1;
  }
  bVar2 = QWidgetTextControl::canInsertFromMimeData((QWidgetTextControl *)this,source);
  return bVar2;
}

Assistant:

bool QPlainTextEditControl::canInsertFromMimeData(const QMimeData *source) const {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        return QWidgetTextControl::canInsertFromMimeData(source);
    return ed->canInsertFromMimeData(source);
}